

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall minibag::Bag::stopWritingChunk(Bag *this)

{
  uint uVar1;
  uint64_t uVar2;
  element_type *peVar3;
  Bag *in_RDI;
  uint64_t end_of_chunk_pos;
  uint32_t compressed_size;
  uint32_t uncompressed_size;
  CompressionType in_stack_0000004c;
  ChunkedFile *in_stack_00000050;
  uint32_t in_stack_000000d4;
  uint32_t in_stack_000000d8;
  CompressionType in_stack_000000dc;
  Bag *in_stack_000000e0;
  Bag *in_stack_00000150;
  Bag *in_stack_ffffffffffffffd8;
  value_type *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  std::vector<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>::push_back
            ((vector<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
            );
  getChunkOffset(in_stack_ffffffffffffffd8);
  ChunkedFile::setWriteMode(in_stack_00000050,in_stack_0000004c);
  uVar2 = ChunkedFile::getOffset(&in_RDI->file_);
  uVar1 = (int)uVar2 - (int)in_RDI->curr_chunk_data_pos_;
  peVar3 = std::
           __shared_ptr_access<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15ff61);
  (*peVar3->_vptr_EncryptorBase[3])(peVar3,(ulong)uVar1,in_RDI->curr_chunk_data_pos_,&in_RDI->file_)
  ;
  ChunkedFile::getOffset(&in_RDI->file_);
  seek(in_RDI,(uint64_t)in_stack_ffffffffffffffd8,0);
  writeChunkHeader(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d4);
  seek(in_RDI,(uint64_t)in_stack_ffffffffffffffd8,0);
  writeIndexRecords(in_stack_00000150);
  std::
  map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::clear((map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
           *)0x15ffec);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           *)0x160001);
  in_RDI->chunk_open_ = false;
  return;
}

Assistant:

void Bag::stopWritingChunk() {
    // Add this chunk to the index
    chunks_.push_back(curr_chunk_info_);
    
    // Get the uncompressed and compressed sizes
    uint32_t uncompressed_size = getChunkOffset();
    file_.setWriteMode(compression::Uncompressed);
    uint32_t compressed_size = file_.getOffset() - curr_chunk_data_pos_;

    // When encryption is on, compressed_size represents encrypted chunk size;
    // When decrypting, the actual compressed size can be deduced from the decrypted chunk
    compressed_size = encryptor_->encryptChunk(compressed_size, curr_chunk_data_pos_, file_);

    // Rewrite the chunk header with the size of the chunk (remembering current offset)
    uint64_t end_of_chunk_pos = file_.getOffset();

    seek(curr_chunk_info_.pos);
    writeChunkHeader(compression_, compressed_size, uncompressed_size);

    // Write out the indexes and clear them
    seek(end_of_chunk_pos);
    writeIndexRecords();
    curr_chunk_connection_indexes_.clear();

    // Clear the connection counts
    curr_chunk_info_.connection_counts.clear();
    
    // Flag that we're starting a new chunk
    chunk_open_ = false;
}